

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::GenerateDefaultMaterial(ASEImporter *this)

{
  pointer pMVar1;
  pointer pMVar2;
  bool bVar3;
  Parser *pPVar4;
  string local_328;
  Material local_308;
  
  if (this->mParser == (Parser *)0x0) {
    __assert_fail("__null != mParser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                  ,0x10c,"void Assimp::ASEImporter::GenerateDefaultMaterial()");
  }
  pMVar2 = (this->mParser->m_vMeshes).
           super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar4 = this->mParser;
  if (pMVar2 == (pPVar4->m_vMeshes).
                super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      if ((pMVar2->bSkip == false) && (pMVar2->iMaterialIndex == 0xffffffff)) {
        pMVar2->iMaterialIndex =
             (int)((ulong)((long)(pPVar4->m_vMaterials).
                                 super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pPVar4->m_vMaterials).
                                super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x1642c859;
        bVar3 = true;
      }
      pMVar2 = pMVar2 + 1;
      pPVar4 = this->mParser;
    } while (pMVar2 != (pPVar4->m_vMeshes).
                       super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((bVar3) ||
     ((pPVar4->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pPVar4->m_vMaterials).
      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"DefaultMaterial","");
    D3DS::Material::Material(&local_308.super_Material,&local_328);
    local_308.super_Material._vptr_Material = (_func_int **)&PTR__Material_0082e738;
    local_308.avSubMaterials.
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.avSubMaterials.
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.avSubMaterials.
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.pcInstance = (aiMaterial *)0x0;
    local_308.bNeed = false;
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::
    emplace_back<Assimp::ASE::Material>(&pPVar4->m_vMaterials,&local_308);
    local_308.super_Material._vptr_Material = (_func_int **)&PTR__Material_0082e738;
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector
              (&local_308.avSubMaterials);
    D3DS::Material::~Material(&local_308.super_Material);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    pMVar1 = (this->mParser->m_vMaterials).
             super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pMVar1[-1].super_Material.mDiffuse.r = 0.6;
    pMVar1[-1].super_Material.mDiffuse.g = 0.6;
    pMVar1[-1].super_Material.mDiffuse.b = 0.6;
    pMVar1[-1].super_Material.mSpecular.r = 1.0;
    pMVar1[-1].super_Material.mSpecular.g = 1.0;
    *(undefined8 *)&pMVar1[-1].super_Material.mSpecular.b = 0x3d4ccccd3f800000;
    pMVar1[-1].super_Material.mAmbient.g = 0.05;
    pMVar1[-1].super_Material.mAmbient.b = 0.05;
    pMVar1[-1].super_Material.mShading = Gouraud;
  }
  return;
}

Assistant:

void ASEImporter::GenerateDefaultMaterial()
{
    ai_assert(NULL != mParser);

    bool bHas = false;
    for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i) {
        if ((*i).bSkip)continue;
        if (ASE::Face::DEFAULT_MATINDEX == (*i).iMaterialIndex) {
            (*i).iMaterialIndex = (unsigned int)mParser->m_vMaterials.size();
            bHas = true;
        }
    }
    if (bHas || mParser->m_vMaterials.empty())  {
        // add a simple material without submaterials to the parser's list
        mParser->m_vMaterials.push_back ( ASE::Material(AI_DEFAULT_MATERIAL_NAME) );
        ASE::Material& mat = mParser->m_vMaterials.back();

        mat.mDiffuse  = aiColor3D(0.6f,0.6f,0.6f);
        mat.mSpecular = aiColor3D(1.0f,1.0f,1.0f);
        mat.mAmbient  = aiColor3D(0.05f,0.05f,0.05f);
        mat.mShading  = Discreet3DS::Gouraud;
    }
}